

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

void Kit_DsdPrintCofactors(uint *pTruth,int nVars,int nCofLevel,int fVerbose)

{
  int iVar1;
  Kit_DsdNtk_t *pKVar2;
  uint *pOut;
  Kit_DsdNtk_t *pKVar3;
  int local_41c;
  int local_418;
  int local_414;
  int local_410;
  int local_408;
  int nMemSize;
  int nSize;
  int nSteps;
  int s;
  int v4;
  int v3;
  int v2;
  int v1;
  int k;
  int i;
  int nSuppSizeMax;
  int nPrimeSizeCur;
  int nPrimeSizeMax;
  int piCofVar [5];
  uint *local_3b8;
  uint *ppCofs [5] [16];
  Kit_DsdNtk_t *pTemp;
  Kit_DsdNtk_t *ppNtks [32];
  int fVerbose_local;
  int nCofLevel_local;
  int nVars_local;
  uint *pTruth_local;
  
  memset(&pTemp,0,0x100);
  if (4 < nCofLevel) {
    __assert_fail("nCofLevel < 5",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0xafb,"void Kit_DsdPrintCofactors(unsigned int *, int, int, int)");
  }
  pKVar2 = Kit_DsdDecompose(pTruth,nVars);
  pTemp = pKVar2;
  pTemp = Kit_DsdExpand(pKVar2);
  Kit_DsdNtkFree(pKVar2);
  if (fVerbose != 0) {
    Kit_DsdPrint(_stdout,pTemp);
    printf("\n");
  }
  Kit_DsdNtkFree(pTemp);
  iVar1 = Kit_TruthWordNum(nVars);
  pOut = (uint *)malloc((long)(iVar1 * 0x50) << 2);
  local_408 = 0;
  for (v1 = 0; v1 < 5; v1 = v1 + 1) {
    for (v2 = 0; v2 < 0x10; v2 = v2 + 1) {
      ppCofs[(long)v1 + -1][(long)v2 + 0xf] = pOut + iVar1 * local_408;
      local_408 = local_408 + 1;
    }
  }
  if (local_408 != 0x50) {
    __assert_fail("nSize == 80",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0xb0c,"void Kit_DsdPrintCofactors(unsigned int *, int, int, int)");
  }
  Kit_TruthCopy(pOut,pTruth,nVars);
  if (nCofLevel == 1) {
    for (v3 = 0; v3 < nVars; v3 = v3 + 1) {
      nPrimeSizeCur = v3;
      printf("    Variables { ");
      for (v1 = 0; v1 < 1; v1 = v1 + 1) {
        printf("%c ",(ulong)((&nPrimeSizeCur)[v1] + 0x61));
      }
      printf("}\n");
      for (nSize = 1; nSize < 2; nSize = nSize + 1) {
        for (v2 = 0; v2 < nSize; v2 = v2 + 1) {
          for (v1 = 0; v1 < 1 << ((byte)v2 & 0x1f); v1 = v1 + 1) {
            Kit_TruthCofactor0New
                      (ppCofs[(long)(v2 + 1) + -1][(long)(v1 << 1) + 0xf],
                       ppCofs[(long)v2 + -1][(long)v1 + 0xf],nVars,(&nPrimeSizeCur)[v2]);
            Kit_TruthCofactor1New
                      (ppCofs[(long)(v2 + 1) + -1][(long)(v1 * 2 + 1) + 0xf],
                       ppCofs[(long)v2 + -1][(long)v1 + 0xf],nVars,(&nPrimeSizeCur)[v2]);
          }
        }
      }
      nSuppSizeMax = 0;
      k = 0;
      for (v1 = 0; v1 < 2; v1 = v1 + 1) {
        pKVar2 = Kit_DsdDecompose(ppCofs[0][(long)v1 + 0xf],nVars);
        ppNtks[(long)v1 + -1] = pKVar2;
        pKVar2 = ppNtks[(long)v1 + -1];
        pKVar3 = Kit_DsdExpand(pKVar2);
        ppNtks[(long)v1 + -1] = pKVar3;
        Kit_DsdNtkFree(pKVar2);
        if (fVerbose != 0) {
          printf("Cof%d%d: ",1,(ulong)(uint)v1);
          Kit_DsdPrint(_stdout,ppNtks[(long)v1 + -1]);
          printf("\n");
        }
        local_410 = Kit_DsdNonDsdSizeMax(ppNtks[(long)v1 + -1]);
        if (local_410 < nSuppSizeMax) {
          local_410 = nSuppSizeMax;
        }
        nSuppSizeMax = local_410;
        Kit_DsdNtkFree(ppNtks[(long)v1 + -1]);
        iVar1 = Kit_TruthSupportSize(ppCofs[0][(long)v1 + 0xf],nVars);
        k = iVar1 + k;
      }
      printf("Max = %2d. Supps = %2d.\n",(ulong)(uint)nSuppSizeMax,(ulong)(uint)k);
    }
  }
  if (nCofLevel == 2) {
    for (v3 = 0; v4 = v3, v3 < nVars; v3 = v3 + 1) {
      while (v4 = v4 + 1, v4 < nVars) {
        nPrimeSizeCur = v3;
        nPrimeSizeMax = v4;
        printf("    Variables { ");
        for (v1 = 0; v1 < 2; v1 = v1 + 1) {
          printf("%c ",(ulong)((&nPrimeSizeCur)[v1] + 0x61));
        }
        printf("}\n");
        for (nSize = 1; nSize < 3; nSize = nSize + 1) {
          for (v2 = 0; v2 < nSize; v2 = v2 + 1) {
            for (v1 = 0; v1 < 1 << ((byte)v2 & 0x1f); v1 = v1 + 1) {
              Kit_TruthCofactor0New
                        (ppCofs[(long)(v2 + 1) + -1][(long)(v1 << 1) + 0xf],
                         ppCofs[(long)v2 + -1][(long)v1 + 0xf],nVars,(&nPrimeSizeCur)[v2]);
              Kit_TruthCofactor1New
                        (ppCofs[(long)(v2 + 1) + -1][(long)(v1 * 2 + 1) + 0xf],
                         ppCofs[(long)v2 + -1][(long)v1 + 0xf],nVars,(&nPrimeSizeCur)[v2]);
            }
          }
        }
        nSuppSizeMax = 0;
        k = 0;
        for (v1 = 0; v1 < 4; v1 = v1 + 1) {
          pKVar2 = Kit_DsdDecompose(ppCofs[1][(long)v1 + 0xf],nVars);
          ppNtks[(long)v1 + -1] = pKVar2;
          pKVar2 = ppNtks[(long)v1 + -1];
          pKVar3 = Kit_DsdExpand(pKVar2);
          ppNtks[(long)v1 + -1] = pKVar3;
          Kit_DsdNtkFree(pKVar2);
          if (fVerbose != 0) {
            printf("Cof%d%d: ",2,(ulong)(uint)v1);
            Kit_DsdPrint(_stdout,ppNtks[(long)v1 + -1]);
            printf("\n");
          }
          local_414 = Kit_DsdNonDsdSizeMax(ppNtks[(long)v1 + -1]);
          if (local_414 < nSuppSizeMax) {
            local_414 = nSuppSizeMax;
          }
          nSuppSizeMax = local_414;
          Kit_DsdNtkFree(ppNtks[(long)v1 + -1]);
          iVar1 = Kit_TruthSupportSize(ppCofs[1][(long)v1 + 0xf],nVars);
          k = iVar1 + k;
        }
        printf("Max = %2d. Supps = %2d.\n",(ulong)(uint)nSuppSizeMax,(ulong)(uint)k);
      }
    }
  }
  if (nCofLevel == 3) {
    for (v3 = 0; iVar1 = v3, v3 < nVars; v3 = v3 + 1) {
      while (v4 = iVar1 + 1, v4 < nVars) {
        for (s = iVar1 + 2; iVar1 = v4, s < nVars; s = s + 1) {
          nPrimeSizeCur = v3;
          nPrimeSizeMax = v4;
          piCofVar[0] = s;
          printf("    Variables { ");
          for (v1 = 0; v1 < 3; v1 = v1 + 1) {
            printf("%c ",(ulong)((&nPrimeSizeCur)[v1] + 0x61));
          }
          printf("}\n");
          for (nSize = 1; nSize < 4; nSize = nSize + 1) {
            for (v2 = 0; v2 < nSize; v2 = v2 + 1) {
              for (v1 = 0; v1 < 1 << ((byte)v2 & 0x1f); v1 = v1 + 1) {
                Kit_TruthCofactor0New
                          (ppCofs[(long)(v2 + 1) + -1][(long)(v1 << 1) + 0xf],
                           ppCofs[(long)v2 + -1][(long)v1 + 0xf],nVars,(&nPrimeSizeCur)[v2]);
                Kit_TruthCofactor1New
                          (ppCofs[(long)(v2 + 1) + -1][(long)(v1 * 2 + 1) + 0xf],
                           ppCofs[(long)v2 + -1][(long)v1 + 0xf],nVars,(&nPrimeSizeCur)[v2]);
              }
            }
          }
          nSuppSizeMax = 0;
          k = 0;
          for (v1 = 0; v1 < 8; v1 = v1 + 1) {
            pKVar2 = Kit_DsdDecompose(ppCofs[2][(long)v1 + 0xf],nVars);
            ppNtks[(long)v1 + -1] = pKVar2;
            pKVar2 = ppNtks[(long)v1 + -1];
            pKVar3 = Kit_DsdExpand(pKVar2);
            ppNtks[(long)v1 + -1] = pKVar3;
            Kit_DsdNtkFree(pKVar2);
            if (fVerbose != 0) {
              printf("Cof%d%d: ",3,(ulong)(uint)v1);
              Kit_DsdPrint(_stdout,ppNtks[(long)v1 + -1]);
              printf("\n");
            }
            local_418 = Kit_DsdNonDsdSizeMax(ppNtks[(long)v1 + -1]);
            if (local_418 < nSuppSizeMax) {
              local_418 = nSuppSizeMax;
            }
            nSuppSizeMax = local_418;
            Kit_DsdNtkFree(ppNtks[(long)v1 + -1]);
            iVar1 = Kit_TruthSupportSize(ppCofs[2][(long)v1 + 0xf],nVars);
            k = iVar1 + k;
          }
          printf("Max = %2d. Supps = %2d.\n",(ulong)(uint)nSuppSizeMax,(ulong)(uint)k);
        }
      }
    }
  }
  if (nCofLevel == 4) {
    for (v3 = 0; iVar1 = v3, v3 < nVars; v3 = v3 + 1) {
      while (v4 = iVar1 + 1, v4 < nVars) {
        for (s = iVar1 + 2; iVar1 = v4, nSteps = s, s < nVars; s = s + 1) {
          while (nSteps = nSteps + 1, nSteps < nVars) {
            nPrimeSizeCur = v3;
            nPrimeSizeMax = v4;
            piCofVar[0] = s;
            piCofVar[1] = nSteps;
            printf("    Variables { ");
            for (v1 = 0; v1 < 4; v1 = v1 + 1) {
              printf("%c ",(ulong)((&nPrimeSizeCur)[v1] + 0x61));
            }
            printf("}\n");
            for (nSize = 1; nSize < 5; nSize = nSize + 1) {
              for (v2 = 0; v2 < nSize; v2 = v2 + 1) {
                for (v1 = 0; v1 < 1 << ((byte)v2 & 0x1f); v1 = v1 + 1) {
                  Kit_TruthCofactor0New
                            (ppCofs[(long)(v2 + 1) + -1][(long)(v1 << 1) + 0xf],
                             ppCofs[(long)v2 + -1][(long)v1 + 0xf],nVars,(&nPrimeSizeCur)[v2]);
                  Kit_TruthCofactor1New
                            (ppCofs[(long)(v2 + 1) + -1][(long)(v1 * 2 + 1) + 0xf],
                             ppCofs[(long)v2 + -1][(long)v1 + 0xf],nVars,(&nPrimeSizeCur)[v2]);
                }
              }
            }
            nSuppSizeMax = 0;
            k = 0;
            for (v1 = 0; v1 < 0x10; v1 = v1 + 1) {
              pKVar2 = Kit_DsdDecompose(ppCofs[3][(long)v1 + 0xf],nVars);
              ppNtks[(long)v1 + -1] = pKVar2;
              pKVar2 = ppNtks[(long)v1 + -1];
              pKVar3 = Kit_DsdExpand(pKVar2);
              ppNtks[(long)v1 + -1] = pKVar3;
              Kit_DsdNtkFree(pKVar2);
              if (fVerbose != 0) {
                printf("Cof%d%d: ",4,(ulong)(uint)v1);
                Kit_DsdPrint(_stdout,ppNtks[(long)v1 + -1]);
                printf("\n");
              }
              local_41c = Kit_DsdNonDsdSizeMax(ppNtks[(long)v1 + -1]);
              if (local_41c < nSuppSizeMax) {
                local_41c = nSuppSizeMax;
              }
              nSuppSizeMax = local_41c;
              Kit_DsdNtkFree(ppNtks[(long)v1 + -1]);
              iVar1 = Kit_TruthSupportSize(ppCofs[3][(long)v1 + 0xf],nVars);
              k = iVar1 + k;
            }
            printf("Max = %2d. Supps = %2d.\n",(ulong)(uint)nSuppSizeMax,(ulong)(uint)k);
          }
        }
      }
    }
  }
  if (pOut != (uint *)0x0) {
    free(pOut);
  }
  return;
}

Assistant:

void Kit_DsdPrintCofactors( unsigned * pTruth, int nVars, int nCofLevel, int fVerbose )
{
    Kit_DsdNtk_t * ppNtks[32] = {0}, * pTemp;
    unsigned * ppCofs[5][16];
    int piCofVar[5];
    int nPrimeSizeMax, nPrimeSizeCur, nSuppSizeMax;
    int i, k, v1, v2, v3, v4, s, nSteps, nSize, nMemSize;
    assert( nCofLevel < 5 );

    // print the function
    ppNtks[0] = Kit_DsdDecompose( pTruth, nVars );
    ppNtks[0] = Kit_DsdExpand( pTemp = ppNtks[0] );
    Kit_DsdNtkFree( pTemp );
    if ( fVerbose )
        Kit_DsdPrint( stdout, ppNtks[0] ), printf( "\n" );
    Kit_DsdNtkFree( ppNtks[0] );

    // allocate storage for cofactors
    nMemSize = Kit_TruthWordNum(nVars);
    ppCofs[0][0] = ABC_ALLOC( unsigned, 80 * nMemSize );
    nSize = 0;
    for ( i = 0; i <  5; i++ )
    for ( k = 0; k < 16; k++ )
        ppCofs[i][k] = ppCofs[0][0] + nMemSize * nSize++;
    assert( nSize == 80 );

    // copy the function
    Kit_TruthCopy( ppCofs[0][0], pTruth, nVars );

    if ( nCofLevel == 1 )
    for ( v1 = 0; v1 < nVars; v1++ )
    {
        nSteps = 0;
        piCofVar[nSteps++] = v1;

        printf( "    Variables { " );
        for ( i = 0; i < nSteps; i++ )
            printf( "%c ", 'a' + piCofVar[i] );
        printf( "}\n" );

        // single cofactors
        for ( s = 1; s <= nSteps; s++ )
        {
            for ( k = 0; k < s; k++ )
            {
                nSize = (1 << k);
                for ( i = 0; i < nSize; i++ )
                {
                    Kit_TruthCofactor0New( ppCofs[k+1][2*i+0], ppCofs[k][i], nVars, piCofVar[k] );
                    Kit_TruthCofactor1New( ppCofs[k+1][2*i+1], ppCofs[k][i], nVars, piCofVar[k] );
                }
            }
        }
        // compute DSD networks
        nSize = (1 << nSteps);
        nPrimeSizeMax = 0;
        nSuppSizeMax = 0;
        for ( i = 0; i < nSize; i++ )
        {
            ppNtks[i] = Kit_DsdDecompose( ppCofs[nSteps][i], nVars );
            ppNtks[i] = Kit_DsdExpand( pTemp = ppNtks[i] );
            Kit_DsdNtkFree( pTemp );
            if ( fVerbose )
            {
                printf( "Cof%d%d: ", nSteps, i );
                Kit_DsdPrint( stdout, ppNtks[i] ), printf( "\n" );
            }
            // compute the largest non-decomp block
            nPrimeSizeCur  = Kit_DsdNonDsdSizeMax(ppNtks[i]);
            nPrimeSizeMax  = KIT_MAX( nPrimeSizeMax, nPrimeSizeCur );
            Kit_DsdNtkFree( ppNtks[i] );
            nSuppSizeMax += Kit_TruthSupportSize( ppCofs[nSteps][i], nVars );
        }
        printf( "Max = %2d. Supps = %2d.\n", nPrimeSizeMax, nSuppSizeMax );
    }

    if ( nCofLevel == 2 )
    for ( v1 = 0; v1 < nVars; v1++ )
    for ( v2 = v1+1; v2 < nVars; v2++ )
    {
        nSteps = 0;
        piCofVar[nSteps++] = v1;
        piCofVar[nSteps++] = v2;

        printf( "    Variables { " );
        for ( i = 0; i < nSteps; i++ )
            printf( "%c ", 'a' + piCofVar[i] );
        printf( "}\n" );

        // single cofactors
        for ( s = 1; s <= nSteps; s++ )
        {
            for ( k = 0; k < s; k++ )
            {
                nSize = (1 << k);
                for ( i = 0; i < nSize; i++ )
                {
                    Kit_TruthCofactor0New( ppCofs[k+1][2*i+0], ppCofs[k][i], nVars, piCofVar[k] );
                    Kit_TruthCofactor1New( ppCofs[k+1][2*i+1], ppCofs[k][i], nVars, piCofVar[k] );
                }
            }
        }
        // compute DSD networks
        nSize = (1 << nSteps);
        nPrimeSizeMax = 0;
        nSuppSizeMax = 0;
        for ( i = 0; i < nSize; i++ )
        {
            ppNtks[i] = Kit_DsdDecompose( ppCofs[nSteps][i], nVars );
            ppNtks[i] = Kit_DsdExpand( pTemp = ppNtks[i] );
            Kit_DsdNtkFree( pTemp );
            if ( fVerbose )
            {
                printf( "Cof%d%d: ", nSteps, i );
                Kit_DsdPrint( stdout, ppNtks[i] ), printf( "\n" );
            }
            // compute the largest non-decomp block
            nPrimeSizeCur  = Kit_DsdNonDsdSizeMax(ppNtks[i]);
            nPrimeSizeMax  = KIT_MAX( nPrimeSizeMax, nPrimeSizeCur );
            Kit_DsdNtkFree( ppNtks[i] );
            nSuppSizeMax += Kit_TruthSupportSize( ppCofs[nSteps][i], nVars );
        }
        printf( "Max = %2d. Supps = %2d.\n", nPrimeSizeMax, nSuppSizeMax );
    }

    if ( nCofLevel == 3 )
    for ( v1 = 0; v1 < nVars; v1++ )
    for ( v2 = v1+1; v2 < nVars; v2++ )
    for ( v3 = v2+1; v3 < nVars; v3++ )
    {
        nSteps = 0;
        piCofVar[nSteps++] = v1;
        piCofVar[nSteps++] = v2;
        piCofVar[nSteps++] = v3;

        printf( "    Variables { " );
        for ( i = 0; i < nSteps; i++ )
            printf( "%c ", 'a' + piCofVar[i] );
        printf( "}\n" );

        // single cofactors
        for ( s = 1; s <= nSteps; s++ )
        {
            for ( k = 0; k < s; k++ )
            {
                nSize = (1 << k);
                for ( i = 0; i < nSize; i++ )
                {
                    Kit_TruthCofactor0New( ppCofs[k+1][2*i+0], ppCofs[k][i], nVars, piCofVar[k] );
                    Kit_TruthCofactor1New( ppCofs[k+1][2*i+1], ppCofs[k][i], nVars, piCofVar[k] );
                }
            }
        }
        // compute DSD networks
        nSize = (1 << nSteps);
        nPrimeSizeMax = 0;
        nSuppSizeMax = 0;
        for ( i = 0; i < nSize; i++ )
        {
            ppNtks[i] = Kit_DsdDecompose( ppCofs[nSteps][i], nVars );
            ppNtks[i] = Kit_DsdExpand( pTemp = ppNtks[i] );
            Kit_DsdNtkFree( pTemp );
            if ( fVerbose )
            {
                printf( "Cof%d%d: ", nSteps, i );
                Kit_DsdPrint( stdout, ppNtks[i] ), printf( "\n" );
            }
            // compute the largest non-decomp block
            nPrimeSizeCur  = Kit_DsdNonDsdSizeMax(ppNtks[i]);
            nPrimeSizeMax  = KIT_MAX( nPrimeSizeMax, nPrimeSizeCur );
            Kit_DsdNtkFree( ppNtks[i] );
            nSuppSizeMax += Kit_TruthSupportSize( ppCofs[nSteps][i], nVars );
        }
        printf( "Max = %2d. Supps = %2d.\n", nPrimeSizeMax, nSuppSizeMax );
    }

    if ( nCofLevel == 4 )
    for ( v1 = 0; v1 < nVars; v1++ )
    for ( v2 = v1+1; v2 < nVars; v2++ )
    for ( v3 = v2+1; v3 < nVars; v3++ )
    for ( v4 = v3+1; v4 < nVars; v4++ )
    {
        nSteps = 0;
        piCofVar[nSteps++] = v1;
        piCofVar[nSteps++] = v2;
        piCofVar[nSteps++] = v3;
        piCofVar[nSteps++] = v4;

        printf( "    Variables { " );
        for ( i = 0; i < nSteps; i++ )
            printf( "%c ", 'a' + piCofVar[i] );
        printf( "}\n" );

        // single cofactors
        for ( s = 1; s <= nSteps; s++ )
        {
            for ( k = 0; k < s; k++ )
            {
                nSize = (1 << k);
                for ( i = 0; i < nSize; i++ )
                {
                    Kit_TruthCofactor0New( ppCofs[k+1][2*i+0], ppCofs[k][i], nVars, piCofVar[k] );
                    Kit_TruthCofactor1New( ppCofs[k+1][2*i+1], ppCofs[k][i], nVars, piCofVar[k] );
                }
            }
        }
        // compute DSD networks
        nSize = (1 << nSteps);
        nPrimeSizeMax = 0;
        nSuppSizeMax = 0;
        for ( i = 0; i < nSize; i++ )
        {
            ppNtks[i] = Kit_DsdDecompose( ppCofs[nSteps][i], nVars );
            ppNtks[i] = Kit_DsdExpand( pTemp = ppNtks[i] );
            Kit_DsdNtkFree( pTemp );
            if ( fVerbose )
            {
                printf( "Cof%d%d: ", nSteps, i );
                Kit_DsdPrint( stdout, ppNtks[i] ), printf( "\n" );
            }
            // compute the largest non-decomp block
            nPrimeSizeCur  = Kit_DsdNonDsdSizeMax(ppNtks[i]);
            nPrimeSizeMax  = KIT_MAX( nPrimeSizeMax, nPrimeSizeCur );
            Kit_DsdNtkFree( ppNtks[i] );
            nSuppSizeMax += Kit_TruthSupportSize( ppCofs[nSteps][i], nVars );
        }
        printf( "Max = %2d. Supps = %2d.\n", nPrimeSizeMax, nSuppSizeMax );
    }


    ABC_FREE( ppCofs[0][0] );
}